

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

void __thiscall
ExchangeCompilation_MissingDefinitions_Test::TestBody
          (ExchangeCompilation_MissingDefinitions_Test *this)

{
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  **ppuVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  parser<pstore::exchange::import_ns::callbacks> *ppVar3;
  ostream *poVar4;
  pointer *__ptr;
  database *db;
  pointer message;
  char *in_R9;
  error_code eVar5;
  mock_mutex mutex;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  digest compilation_digest;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_names;
  AssertHelper AStack_2d8;
  undefined1 local_2c9;
  error_code local_2c8;
  undefined1 local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  **local_288;
  index_type local_280;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  *local_278;
  undefined4 local_270;
  undefined1 local_26c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  index_type local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  transaction<std::unique_lock<mock_mutex>_> local_230;
  parser<pstore::exchange::import_ns::callbacks> local_1f8;
  undefined1 local_150 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  local_148;
  int local_f8;
  error_category *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string_mapping local_a8;
  
  local_278 = (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
               *)0x6c7069727422205b;
  local_270 = 0x5d202265;
  local_280 = 0xc;
  local_26c = 0;
  local_258._M_dataplus._M_p._0_7_ = 0x7069727422207b;
  local_258._M_dataplus._M_p._7_1_ = 0x6c;
  local_258._M_string_length._0_7_ = 0x7d2030203a2265;
  local_260 = 0xf;
  local_258._M_string_length._7_1_ = 0;
  local_258.field_2._M_allocated_capacity = 0x9abcdef0;
  local_258.field_2._8_8_ = 0x12345678;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_150 = (undefined1  [8])&local_2c9;
  local_148.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map._0_1_ = false;
  local_288 = &local_278;
  local_268 = &local_258;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_150);
  db = &(this->super_ExchangeCompilation).import_db_;
  local_148.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_230,db,(lock_type *)local_150);
  anon_unknown.dwarf_a82ba::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_150,&local_230,&local_a8);
  ppuVar1 = local_288;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_1f8,local_280);
  local_1f8.stack_.c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = ppuVar1;
  ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
           input<pstore::gsl::span<char_const,_1l>>
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_150,
                      (span<const_char,__1L> *)&local_1f8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
  local_298[0] = (internal)(local_f8 == 0);
  local_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((bool)local_298[0]) {
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)local_298,db,true);
    anon_unknown.dwarf_a82ba::import_compilation_parser
              (&local_1f8,&local_230,&local_a8,
               (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)local_298,(digest *)&local_258.field_2);
    pbVar2 = local_268;
    pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_2b8,local_260);
    local_2b0 = pbVar2;
    ppVar3 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
             input<pstore::gsl::span<char_const,_1l>>(&local_1f8,(span<const_char,__1L> *)local_2b8)
    ;
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar3);
    eVar5 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
    local_2c8._M_cat = eVar5._M_cat;
    local_2c8._M_value = eVar5._M_value;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)local_2b8,"compilation_parser.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)"
               ,&local_1f8.error_,&local_2c8);
    if (local_2b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2c8);
      if (local_2b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_2b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0x16a,message);
      testing::internal::AssertHelper::operator=(&AStack_2d8,(Message *)&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&AStack_2d8);
      if ((long *)CONCAT44(local_2c8._4_4_,local_2c8._M_value) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 8))();
      }
    }
    if (local_2b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2b0,local_2b0);
    }
    pstore::transaction_base::commit(&local_230.super_transaction_base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.string_._M_dataplus._M_p != &local_1f8.string_.field_2) {
      operator_delete(local_1f8.string_._M_dataplus._M_p,
                      local_1f8.string_.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8.callbacks_.context_.
        super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.callbacks_.context_.
                 super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque(&local_1f8.stack_.c);
    if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
         )local_1f8.singletons_._M_t.
          super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          .
          super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
          ._M_head_impl != (singleton_storage<pstore::exchange::import_ns::callbacks> *)0x0) {
      operator_delete((void *)local_1f8.singletons_._M_t.
                              super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              .
                              super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                              ._M_head_impl,0x68);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290._M_pi);
    }
  }
  else {
    testing::Message::Message((Message *)&local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),"JSON error was: ",
               0x10);
    (**(code **)(*(long *)local_f0 + 0x20))(&local_1f8,local_f0,local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),
               (char *)local_1f8.singletons_._M_t.
                       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                       .
                       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                       ._M_head_impl,
               (long)local_1f8.stack_.c.
                     super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map);
    local_2b8[0] = (internal)0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),local_2b8,1);
    local_2b8[0] = (internal)0x28;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),local_2b8,1
                       );
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_2b8[0] = (internal)0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2b8,1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_2b8[0] = (internal)0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2b8,1);
    local_2b8[0] = (internal)0xa;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),local_2b8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 0x10),(char *)local_288,
               local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b8,(internal *)local_298,
               (AssertionResult *)"name_parser.has_error ()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_2d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x15f,(char *)local_2b8);
    testing::internal::AssertHelper::operator=(&AStack_2d8,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&AStack_2d8);
    if (local_2b8 != (undefined1  [8])&local_2a8) {
      operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_1f8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
         )((long)&local_1f8.stack_.c + 8U)) {
      operator_delete((void *)local_1f8.singletons_._M_t.
                              super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                              .
                              super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                              ._M_head_impl,
                      local_1f8.stack_.c.
                      super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size + 1);
    }
    if ((long *)CONCAT44(local_2c8._4_4_,local_2c8._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2c8._4_4_,local_2c8._M_value) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_290._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_148);
  if (local_150 != (undefined1  [8])0x0) {
    operator_delete((void *)local_150,0x68);
  }
  local_230.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00234578
  ;
  pstore::transaction_base::rollback(&local_230.super_transaction_base);
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT17(local_258._M_dataplus._M_p._7_1_,local_258._M_dataplus._M_p._0_7_) + 1)
    ;
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,
                    (ulong)&(local_278->_M_t).
                            super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                            .field_0x1);
  }
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingDefinitions) {
    auto const names = R"([ "triple" ])"s;
    auto const compilation = R"({ "triple": 0 })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});
    auto name_parser = import_strings_parser (&transaction, &imported_names);
    name_parser.input (names).eof ();
    ASSERT_FALSE (name_parser.has_error ())
        << "JSON error was: " << name_parser.last_error ().message () << ' '
        << name_parser.coordinate () << '\n'
        << names;

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}